

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

QSize __thiscall QDockWidgetLayout::minimumSize(QDockWidgetLayout *this)

{
  const_reference ppQVar1;
  undefined1 extraout_var;
  QSize QVar2;
  long in_FS_OFFSET;
  QDockWidgetLayout *unaff_retaddr;
  QDockWidget *w;
  QSize content;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize *in_stack_ffffffffffffffc0;
  QLayout *in_stack_ffffffffffffffd0;
  undefined1 floating;
  QSize *content_00;
  
  content_00 = *(QSize **)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(in_stack_ffffffffffffffd0);
  qobject_cast<QDockWidget*>((QObject *)0x58b6e2);
  floating = 0xaa;
  QSize::QSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  ppQVar1 = QList<QLayoutItem_*>::operator[]
                      ((QList<QLayoutItem_*> *)in_stack_ffffffffffffffc0,
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (*ppQVar1 != (QLayoutItem *)0x0) {
    ppQVar1 = QList<QLayoutItem_*>::operator[]
                        ((QList<QLayoutItem_*> *)in_stack_ffffffffffffffc0,
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    (*(*ppQVar1)->_vptr_QLayoutItem[3])();
    floating = extraout_var;
  }
  QDockWidget::isFloating((QDockWidget *)0x58b74d);
  QVar2 = sizeFromContent(unaff_retaddr,content_00,(bool)floating);
  if (*(QSize **)(in_FS_OFFSET + 0x28) == content_00) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetLayout::minimumSize() const
{
    QDockWidget *w = qobject_cast<QDockWidget*>(parentWidget());

    QSize content(0, 0);
    if (item_list[Content] != 0)
        content = item_list[Content]->minimumSize();

    return sizeFromContent(content, w->isFloating());
}